

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GAServices.cc
# Opt level: O0

GlobalArray * __thiscall
GA::GAServices::createGA_Ghosts
          (GAServices *this,int type,int ndim,int *dims,int *width,char *array_name,int *chunk)

{
  GlobalArray *width_00;
  char in_CL;
  int *in_R8;
  GlobalArray *GA;
  undefined4 in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  GlobalArray *in_stack_ffffffffffffffd0;
  
  width_00 = (GlobalArray *)operator_new(4);
  GA::GlobalArray::GlobalArray
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,(int *)width_00,
             (char *)CONCAT44(in_stack_ffffffffffffffb4,0x67),in_R8,in_CL);
  return width_00;
}

Assistant:

GA::GlobalArray * 
GA::GAServices::createGA_Ghosts(int type, int ndim, int dims[], int width[],
				char *array_name, int chunk[]) {
  /* last argument is a dummy argument, just to increase the count of the 
     number of arguments, inorder to avoid conflict in # of args */
  GA::GlobalArray * GA = new GA::GlobalArray(type, ndim, dims, width, 
					     array_name, chunk, 'g');
  return GA;
}